

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  ostream *stream;
  bool bVar1;
  long lVar2;
  string expr;
  undefined1 local_30 [12];
  uint uStack_24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    stream = this->stream;
    local_30._0_8_ = this->colourImpl;
    local_30._8_4_ = FileName;
    uStack_24 = uStack_24 & 0xffffff00;
    ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_30,stream);
    std::__ostream_insert<char,std::char_traits<char>>(stream," for: ",6);
    if (uStack_24._0_1_ == true) {
      (**(code **)(*(size_type *)local_30._0_8_ + 0x10))(local_30._0_8_,0);
    }
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_30,this->result);
    if (CONCAT44(uStack_24,local_30._8_4_) != 0) {
      lVar2 = 0;
      do {
        if (*(char *)(local_30._0_8_ + lVar2) == '\n') {
          *(char *)(local_30._0_8_ + lVar2) = ' ';
        }
        lVar2 = lVar2 + 1;
      } while (CONCAT44(uStack_24,local_30._8_4_) != lVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (this->stream,(char *)local_30._0_8_,CONCAT44(uStack_24,local_30._8_4_));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._0_8_ != &local_20) {
      operator_delete((void *)local_30._0_8_,local_20._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    stream << colourImpl->guardColour( tapDimColour ) << " for: ";

                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }